

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

void __thiscall
icu_63::AnnualTimeZoneRule::AnnualTimeZoneRule
          (AnnualTimeZoneRule *this,UnicodeString *name,int32_t rawOffset,int32_t dstSavings,
          DateTimeRule *dateTimeRule,int32_t startYear,int32_t endYear)

{
  DateTimeRule *this_00;
  DateTimeRule *local_48;
  int32_t startYear_local;
  DateTimeRule *dateTimeRule_local;
  int32_t dstSavings_local;
  int32_t rawOffset_local;
  UnicodeString *name_local;
  AnnualTimeZoneRule *this_local;
  
  TimeZoneRule::TimeZoneRule(&this->super_TimeZoneRule,name,rawOffset,dstSavings);
  (this->super_TimeZoneRule).super_UObject._vptr_UObject =
       (_func_int **)&PTR__AnnualTimeZoneRule_0049b390;
  this_00 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)name);
  local_48 = (DateTimeRule *)0x0;
  if (this_00 != (DateTimeRule *)0x0) {
    DateTimeRule::DateTimeRule(this_00,dateTimeRule);
    local_48 = this_00;
  }
  this->fDateTimeRule = local_48;
  this->fStartYear = startYear;
  this->fEndYear = endYear;
  return;
}

Assistant:

AnnualTimeZoneRule::AnnualTimeZoneRule(const UnicodeString& name,
                                       int32_t rawOffset,
                                       int32_t dstSavings, 
                                       const DateTimeRule& dateTimeRule,
                                       int32_t startYear,
                                       int32_t endYear)
: TimeZoneRule(name, rawOffset, dstSavings), fDateTimeRule(new DateTimeRule(dateTimeRule)),
  fStartYear(startYear), fEndYear(endYear) {
}